

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O0

InterCode * __thiscall IrSim::icNoOp(IrSim *this,int kind,C_OP *t)

{
  InterCode *in_RDI;
  Operand *in_stack_ffffffffffffff78;
  Operand *in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffac;
  InterCode *in_stack_ffffffffffffffb0;
  
  Operand::Operand((Operand *)in_RDI,in_stack_ffffffffffffff78);
  InterCode::InterCode
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa0);
  Operand::~Operand((Operand *)0x118415);
  return in_RDI;
}

Assistant:

InterCode icNoOp(int kind, C_OP &t) const { return InterCode(kind, t); }